

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopinv.cpp
# Opt level: O1

void __thiscall
mocker::LoopInvariantCodeMotion::hoist
          (LoopInvariantCodeMotion *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *loopNodes,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *invariant,size_t preHeader)

{
  _Hash_node_base *p_Var1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BasicBlock *pBVar5;
  __node_base_ptr p_Var6;
  ostream *poVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  shared_ptr<mocker::ir::IRInst> *inst;
  __node_base_ptr p_Var10;
  _List_node_base *p_Var11;
  shared_ptr<mocker::ir::IRInst> local_68;
  string local_58;
  BasicBlock *local_38;
  
  local_38 = ir::FunctionModule::getMutableBasicBlock((this->super_FuncPass).func,preHeader);
  p_Var1 = (loopNodes->_M_h)._M_before_begin._M_nxt;
  do {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      removeDeletedInsts((this->super_FuncPass).func);
      return;
    }
    pBVar5 = ir::FunctionModule::getMutableBasicBlock
                       ((this->super_FuncPass).func,(size_t)p_Var1[1]._M_nxt);
    for (p_Var11 = (pBVar5->insts).
                   super__List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var11 != (_List_node_base *)&pBVar5->insts; p_Var11 = p_Var11->_M_next) {
      p_Var8 = p_Var11[1]._M_next;
      uVar2 = (invariant->_M_h)._M_bucket_count;
      uVar9 = (ulong)p_Var8 % uVar2;
      p_Var3 = (invariant->_M_h)._M_buckets[uVar9];
      p_Var6 = (__node_base_ptr)0x0;
      if ((p_Var3 != (__node_base_ptr)0x0) &&
         (p_Var6 = p_Var3, p_Var10 = p_Var3->_M_nxt,
         (_List_node_base *)p_Var3->_M_nxt[1]._M_nxt != p_Var8)) {
        while (p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var6 = (__node_base_ptr)0x0;
          if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar9) ||
             (p_Var6 = p_Var10, p_Var10 = p_Var4, (_List_node_base *)p_Var4[1]._M_nxt == p_Var8))
          goto LAB_00112e45;
        }
        p_Var6 = (__node_base_ptr)0x0;
      }
LAB_00112e45:
      if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"hoist: ",7);
        ir::fmtInst_abi_cxx11_(&local_58,(ir *)(p_Var11 + 1),inst);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_58._M_dataplus._M_p,
                            local_58._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var11[1]._M_next;
        local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
        if (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ir::BasicBlock::appendInstBeforeTerminator(local_38,&local_68);
        if (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        p_Var8 = (_List_node_base *)operator_new(0x20);
        p_Var8->_M_prev = (_List_node_base *)0x100000001;
        p_Var8->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001efd18;
        *(undefined4 *)&p_Var8[1]._M_prev = 0;
        p_Var8[1]._M_next = (_List_node_base *)&PTR__IRInst_001efd68;
        p_Var11[1]._M_next = p_Var8 + 1;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var11[1]._M_prev;
        p_Var11[1]._M_prev = p_Var8;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

void LoopInvariantCodeMotion::hoist(
    const std::unordered_set<std::size_t> &loopNodes,
    const std::unordered_set<ir::InstID> &invariant, std::size_t preHeader) {
  auto &preHeaderBB = func.getMutableBasicBlock(preHeader);
  for (auto node : loopNodes) {
    auto &bb = func.getMutableBasicBlock(node);
    for (auto &inst : bb.getMutableInsts()) {
      if (!isIn(invariant, inst->getID()))
        continue;
      std::cerr << "hoist: " << ir::fmtInst(inst) << std::endl;
      preHeaderBB.appendInstBeforeTerminator(inst);
      inst = std::make_shared<ir::Deleted>();
    }
  }
  removeDeletedInsts(func);
}